

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prelu_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::PReLU_x86_avx512::forward_inplace(PReLU_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  int *piVar1;
  uint uVar2;
  _func_int **pp_Var3;
  _func_int *p_Var4;
  uint *puVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  byte bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  int iVar23;
  uint uVar24;
  uint uVar25;
  float *ptr;
  int iVar26;
  uint uVar27;
  ulong uVar28;
  undefined1 (*pauVar29) [32];
  undefined1 (*pauVar30) [16];
  ulong uVar31;
  int iVar32;
  int iVar33;
  long lVar34;
  uint uVar35;
  undefined1 (*pauVar36) [64];
  undefined1 (*pauVar37) [64];
  ushort uVar38;
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  
  iVar26 = bottom_top_blob->elempack;
  iVar23 = bottom_top_blob->dims;
  iVar32 = bottom_top_blob->w;
  uVar35 = bottom_top_blob->h;
  uVar25 = bottom_top_blob->c;
  if (iVar23 == 3) {
    if (0 < (int)uVar25) {
      uVar35 = iVar32 * iVar26 * uVar35;
      pp_Var3 = this->_vptr_PReLU_x86_avx512;
      uVar28 = 0;
      auVar45 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar39 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar40 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        p_Var4 = pp_Var3[-3];
        iVar23 = *(int *)(&this->field_0xd0 + (long)p_Var4);
        uVar31 = 0;
        if (1 < iVar23) {
          uVar31 = uVar28;
        }
        uVar2 = *(uint *)(*(long *)(&this->field_0xd8 + (long)p_Var4) + uVar31 * 4);
        if (iVar23 < 2 || iVar26 != 4) {
          auVar49._4_4_ = uVar2;
          auVar49._0_4_ = uVar2;
          auVar49._8_4_ = uVar2;
          auVar49._12_4_ = uVar2;
        }
        else {
          auVar49 = *(undefined1 (*) [16])
                     (*(long *)(&this->field_0xd8 + (long)p_Var4) + uVar28 * 0x10);
        }
        if (iVar26 == 8 && 1 < iVar23) {
          auVar51 = *(undefined1 (*) [32])
                     (*(long *)(&this->field_0xd8 + (long)p_Var4) + uVar28 * 0x20);
        }
        else {
          auVar51._16_16_ = auVar49;
          auVar51._0_16_ = auVar49;
        }
        if (iVar26 == 0x10 && 1 < iVar23) {
          auVar43 = *(undefined1 (*) [64])
                     (*(long *)(&this->field_0xd8 + (long)p_Var4) + uVar28 * 0x40);
        }
        else {
          auVar43 = vinsertf64x4_avx512f(ZEXT3264(auVar51),auVar51,1);
        }
        pauVar37 = (undefined1 (*) [64])
                   (bottom_top_blob->cstep * uVar28 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        uVar27 = 0;
        if (0xf < (int)uVar35) {
          iVar23 = 0xf;
          do {
            auVar41 = vmaxps_avx512f(*pauVar37,auVar45);
            auVar42 = vminps_avx512f(*pauVar37,auVar45);
            auVar41 = vfmadd213ps_avx512f(auVar42,auVar43,auVar41);
            *pauVar37 = auVar41;
            pauVar37 = pauVar37 + 1;
            iVar23 = iVar23 + 0x10;
            uVar27 = uVar35 & 0xfffffff0;
          } while (iVar23 < (int)uVar35);
        }
        uVar24 = uVar27 | 7;
        while ((int)uVar24 < (int)uVar35) {
          auVar47 = vmaxps_avx(*(undefined1 (*) [32])*pauVar37,ZEXT1632(ZEXT816(0) << 0x40));
          auVar50 = vminps_avx(*(undefined1 (*) [32])*pauVar37,ZEXT1632(ZEXT816(0) << 0x40));
          auVar46 = vfmadd213ps_fma(auVar50,auVar51,auVar47);
          *(undefined1 (*) [32])*pauVar37 = ZEXT1632(auVar46);
          pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x20);
          uVar24 = uVar27 + 0xf;
          uVar27 = uVar27 + 8;
        }
        uVar24 = uVar27 | 3;
        while ((int)uVar24 < (int)uVar35) {
          auVar46 = vmaxps_avx(*(undefined1 (*) [16])*pauVar37,ZEXT816(0) << 0x40);
          auVar48 = vminps_avx(*(undefined1 (*) [16])*pauVar37,ZEXT816(0) << 0x40);
          auVar46 = vfmadd213ps_fma(auVar48,auVar49,auVar46);
          *(undefined1 (*) [16])*pauVar37 = auVar46;
          pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x10);
          uVar24 = uVar27 + 7;
          uVar27 = uVar27 + 4;
        }
        if ((int)uVar27 < (int)uVar35) {
          auVar43 = vpbroadcastq_avx512f();
          auVar41 = vbroadcastss_avx512f(ZEXT416(uVar2));
          uVar31 = 0;
          do {
            auVar42 = vpbroadcastq_avx512f();
            auVar44 = vporq_avx512f(auVar42,auVar39);
            auVar42 = vporq_avx512f(auVar42,auVar40);
            uVar21 = vpcmpuq_avx512f(auVar42,auVar43,2);
            uVar22 = vpcmpuq_avx512f(auVar44,auVar43,2);
            bVar14 = (byte)uVar22;
            uVar38 = CONCAT11(bVar14,(byte)uVar21);
            piVar1 = (int *)(*pauVar37 + uVar31 * 4);
            auVar44._4_4_ = (uint)((byte)(uVar38 >> 1) & 1) * piVar1[1];
            auVar44._0_4_ = (uint)((byte)uVar21 & 1) * *piVar1;
            auVar44._8_4_ = (uint)((byte)(uVar38 >> 2) & 1) * piVar1[2];
            auVar44._12_4_ = (uint)((byte)(uVar38 >> 3) & 1) * piVar1[3];
            auVar44._16_4_ = (uint)((byte)(uVar38 >> 4) & 1) * piVar1[4];
            auVar44._20_4_ = (uint)((byte)(uVar38 >> 5) & 1) * piVar1[5];
            auVar44._24_4_ = (uint)((byte)(uVar38 >> 6) & 1) * piVar1[6];
            auVar44._28_4_ = (uint)((byte)(uVar38 >> 7) & 1) * piVar1[7];
            auVar44._32_4_ = (uint)(bVar14 & 1) * piVar1[8];
            auVar44._36_4_ = (uint)(bVar14 >> 1 & 1) * piVar1[9];
            auVar44._40_4_ = (uint)(bVar14 >> 2 & 1) * piVar1[10];
            auVar44._44_4_ = (uint)(bVar14 >> 3 & 1) * piVar1[0xb];
            auVar44._48_4_ = (uint)(bVar14 >> 4 & 1) * piVar1[0xc];
            auVar44._52_4_ = (uint)(bVar14 >> 5 & 1) * piVar1[0xd];
            auVar44._56_4_ = (uint)(bVar14 >> 6 & 1) * piVar1[0xe];
            auVar44._60_4_ = (uint)(bVar14 >> 7) * piVar1[0xf];
            uVar21 = vcmpps_avx512f(auVar44,auVar45,1);
            uVar38 = uVar38 & (ushort)uVar21;
            auVar42 = vmulps_avx512f(auVar44,auVar41);
            puVar5 = (uint *)(*pauVar37 + uVar31 * 4);
            bVar6 = (bool)((byte)uVar38 & 1);
            bVar7 = (bool)((byte)(uVar38 >> 1) & 1);
            bVar8 = (bool)((byte)(uVar38 >> 2) & 1);
            bVar9 = (bool)((byte)(uVar38 >> 3) & 1);
            bVar10 = (bool)((byte)(uVar38 >> 4) & 1);
            bVar11 = (bool)((byte)(uVar38 >> 5) & 1);
            bVar12 = (bool)((byte)(uVar38 >> 6) & 1);
            bVar13 = (bool)((byte)(uVar38 >> 7) & 1);
            bVar14 = (byte)(uVar38 >> 8);
            bVar15 = (bool)(bVar14 >> 1 & 1);
            bVar16 = (bool)(bVar14 >> 2 & 1);
            bVar17 = (bool)(bVar14 >> 3 & 1);
            bVar18 = (bool)(bVar14 >> 4 & 1);
            bVar19 = (bool)(bVar14 >> 5 & 1);
            bVar20 = (bool)(bVar14 >> 6 & 1);
            *puVar5 = (uint)bVar6 * auVar42._0_4_ | (uint)!bVar6 * *puVar5;
            puVar5[1] = (uint)bVar7 * auVar42._4_4_ | (uint)!bVar7 * puVar5[1];
            puVar5[2] = (uint)bVar8 * auVar42._8_4_ | (uint)!bVar8 * puVar5[2];
            puVar5[3] = (uint)bVar9 * auVar42._12_4_ | (uint)!bVar9 * puVar5[3];
            puVar5[4] = (uint)bVar10 * auVar42._16_4_ | (uint)!bVar10 * puVar5[4];
            puVar5[5] = (uint)bVar11 * auVar42._20_4_ | (uint)!bVar11 * puVar5[5];
            puVar5[6] = (uint)bVar12 * auVar42._24_4_ | (uint)!bVar12 * puVar5[6];
            puVar5[7] = (uint)bVar13 * auVar42._28_4_ | (uint)!bVar13 * puVar5[7];
            puVar5[8] = (uint)(bVar14 & 1) * auVar42._32_4_ | (uint)!(bool)(bVar14 & 1) * puVar5[8];
            puVar5[9] = (uint)bVar15 * auVar42._36_4_ | (uint)!bVar15 * puVar5[9];
            puVar5[10] = (uint)bVar16 * auVar42._40_4_ | (uint)!bVar16 * puVar5[10];
            puVar5[0xb] = (uint)bVar17 * auVar42._44_4_ | (uint)!bVar17 * puVar5[0xb];
            puVar5[0xc] = (uint)bVar18 * auVar42._48_4_ | (uint)!bVar18 * puVar5[0xc];
            puVar5[0xd] = (uint)bVar19 * auVar42._52_4_ | (uint)!bVar19 * puVar5[0xd];
            puVar5[0xe] = (uint)bVar20 * auVar42._56_4_ | (uint)!bVar20 * puVar5[0xe];
            puVar5[0xf] = (uint)(bVar14 >> 7) * auVar42._60_4_ |
                          (uint)!(bool)(bVar14 >> 7) * puVar5[0xf];
            uVar31 = uVar31 + 0x10;
          } while (((ulong)(~uVar27 + uVar35) + 0x10 & 0x1fffffff0) != uVar31);
        }
        uVar28 = uVar28 + 1;
      } while (uVar28 != uVar25);
    }
  }
  else if (iVar23 == 2) {
    if (0 < (int)uVar35) {
      uVar25 = iVar26 * iVar32;
      pp_Var3 = this->_vptr_PReLU_x86_avx512;
      uVar28 = 0;
      auVar45 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar39 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar40 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        p_Var4 = pp_Var3[-3];
        iVar23 = *(int *)(&this->field_0xd0 + (long)p_Var4);
        uVar31 = 0;
        if (1 < iVar23) {
          uVar31 = uVar28;
        }
        uVar2 = *(uint *)(*(long *)(&this->field_0xd8 + (long)p_Var4) + uVar31 * 4);
        if (iVar23 < 2 || iVar26 != 4) {
          auVar48._4_4_ = uVar2;
          auVar48._0_4_ = uVar2;
          auVar48._8_4_ = uVar2;
          auVar48._12_4_ = uVar2;
        }
        else {
          auVar48 = *(undefined1 (*) [16])
                     (*(long *)(&this->field_0xd8 + (long)p_Var4) + uVar28 * 0x10);
        }
        if (iVar26 == 8 && 1 < iVar23) {
          auVar50 = *(undefined1 (*) [32])
                     (*(long *)(&this->field_0xd8 + (long)p_Var4) + uVar28 * 0x20);
        }
        else {
          auVar50._16_16_ = auVar48;
          auVar50._0_16_ = auVar48;
        }
        if (iVar26 == 0x10 && 1 < iVar23) {
          auVar43 = *(undefined1 (*) [64])
                     (*(long *)(&this->field_0xd8 + (long)p_Var4) + uVar28 * 0x40);
        }
        else {
          auVar43 = vinsertf64x4_avx512f(ZEXT3264(auVar50),auVar50,1);
        }
        pauVar37 = (undefined1 (*) [64])
                   ((long)bottom_top_blob->w * uVar28 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        uVar27 = 0;
        if (0xf < (int)uVar25) {
          iVar23 = 0xf;
          do {
            auVar41 = vmaxps_avx512f(*pauVar37,auVar45);
            auVar42 = vminps_avx512f(*pauVar37,auVar45);
            auVar41 = vfmadd213ps_avx512f(auVar42,auVar43,auVar41);
            *pauVar37 = auVar41;
            pauVar37 = pauVar37 + 1;
            iVar23 = iVar23 + 0x10;
            uVar27 = uVar25 & 0xfffffff0;
          } while (iVar23 < (int)uVar25);
        }
        uVar24 = uVar27 | 7;
        while ((int)uVar24 < (int)uVar25) {
          auVar47 = vmaxps_avx(*(undefined1 (*) [32])*pauVar37,ZEXT1632(ZEXT816(0) << 0x40));
          auVar51 = vminps_avx(*(undefined1 (*) [32])*pauVar37,ZEXT1632(ZEXT816(0) << 0x40));
          auVar46 = vfmadd213ps_fma(auVar51,auVar50,auVar47);
          *(undefined1 (*) [32])*pauVar37 = ZEXT1632(auVar46);
          pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x20);
          uVar24 = uVar27 + 0xf;
          uVar27 = uVar27 + 8;
        }
        uVar24 = uVar27 | 3;
        while ((int)uVar24 < (int)uVar25) {
          auVar46 = vmaxps_avx(*(undefined1 (*) [16])*pauVar37,ZEXT816(0) << 0x40);
          auVar49 = vminps_avx(*(undefined1 (*) [16])*pauVar37,ZEXT816(0) << 0x40);
          auVar46 = vfmadd213ps_fma(auVar49,auVar48,auVar46);
          *(undefined1 (*) [16])*pauVar37 = auVar46;
          pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x10);
          uVar24 = uVar27 + 7;
          uVar27 = uVar27 + 4;
        }
        if ((int)uVar27 < (int)uVar25) {
          auVar43 = vpbroadcastq_avx512f();
          auVar41 = vbroadcastss_avx512f(ZEXT416(uVar2));
          uVar31 = 0;
          do {
            auVar42 = vpbroadcastq_avx512f();
            auVar44 = vporq_avx512f(auVar42,auVar39);
            auVar42 = vporq_avx512f(auVar42,auVar40);
            uVar21 = vpcmpuq_avx512f(auVar42,auVar43,2);
            uVar22 = vpcmpuq_avx512f(auVar44,auVar43,2);
            bVar14 = (byte)uVar22;
            uVar38 = CONCAT11(bVar14,(byte)uVar21);
            piVar1 = (int *)(*pauVar37 + uVar31 * 4);
            auVar42._4_4_ = (uint)((byte)(uVar38 >> 1) & 1) * piVar1[1];
            auVar42._0_4_ = (uint)((byte)uVar21 & 1) * *piVar1;
            auVar42._8_4_ = (uint)((byte)(uVar38 >> 2) & 1) * piVar1[2];
            auVar42._12_4_ = (uint)((byte)(uVar38 >> 3) & 1) * piVar1[3];
            auVar42._16_4_ = (uint)((byte)(uVar38 >> 4) & 1) * piVar1[4];
            auVar42._20_4_ = (uint)((byte)(uVar38 >> 5) & 1) * piVar1[5];
            auVar42._24_4_ = (uint)((byte)(uVar38 >> 6) & 1) * piVar1[6];
            auVar42._28_4_ = (uint)((byte)(uVar38 >> 7) & 1) * piVar1[7];
            auVar42._32_4_ = (uint)(bVar14 & 1) * piVar1[8];
            auVar42._36_4_ = (uint)(bVar14 >> 1 & 1) * piVar1[9];
            auVar42._40_4_ = (uint)(bVar14 >> 2 & 1) * piVar1[10];
            auVar42._44_4_ = (uint)(bVar14 >> 3 & 1) * piVar1[0xb];
            auVar42._48_4_ = (uint)(bVar14 >> 4 & 1) * piVar1[0xc];
            auVar42._52_4_ = (uint)(bVar14 >> 5 & 1) * piVar1[0xd];
            auVar42._56_4_ = (uint)(bVar14 >> 6 & 1) * piVar1[0xe];
            auVar42._60_4_ = (uint)(bVar14 >> 7) * piVar1[0xf];
            uVar21 = vcmpps_avx512f(auVar42,auVar45,1);
            uVar38 = uVar38 & (ushort)uVar21;
            auVar42 = vmulps_avx512f(auVar42,auVar41);
            puVar5 = (uint *)(*pauVar37 + uVar31 * 4);
            bVar6 = (bool)((byte)uVar38 & 1);
            bVar7 = (bool)((byte)(uVar38 >> 1) & 1);
            bVar8 = (bool)((byte)(uVar38 >> 2) & 1);
            bVar9 = (bool)((byte)(uVar38 >> 3) & 1);
            bVar10 = (bool)((byte)(uVar38 >> 4) & 1);
            bVar11 = (bool)((byte)(uVar38 >> 5) & 1);
            bVar12 = (bool)((byte)(uVar38 >> 6) & 1);
            bVar13 = (bool)((byte)(uVar38 >> 7) & 1);
            bVar14 = (byte)(uVar38 >> 8);
            bVar15 = (bool)(bVar14 >> 1 & 1);
            bVar16 = (bool)(bVar14 >> 2 & 1);
            bVar17 = (bool)(bVar14 >> 3 & 1);
            bVar18 = (bool)(bVar14 >> 4 & 1);
            bVar19 = (bool)(bVar14 >> 5 & 1);
            bVar20 = (bool)(bVar14 >> 6 & 1);
            *puVar5 = (uint)bVar6 * auVar42._0_4_ | (uint)!bVar6 * *puVar5;
            puVar5[1] = (uint)bVar7 * auVar42._4_4_ | (uint)!bVar7 * puVar5[1];
            puVar5[2] = (uint)bVar8 * auVar42._8_4_ | (uint)!bVar8 * puVar5[2];
            puVar5[3] = (uint)bVar9 * auVar42._12_4_ | (uint)!bVar9 * puVar5[3];
            puVar5[4] = (uint)bVar10 * auVar42._16_4_ | (uint)!bVar10 * puVar5[4];
            puVar5[5] = (uint)bVar11 * auVar42._20_4_ | (uint)!bVar11 * puVar5[5];
            puVar5[6] = (uint)bVar12 * auVar42._24_4_ | (uint)!bVar12 * puVar5[6];
            puVar5[7] = (uint)bVar13 * auVar42._28_4_ | (uint)!bVar13 * puVar5[7];
            puVar5[8] = (uint)(bVar14 & 1) * auVar42._32_4_ | (uint)!(bool)(bVar14 & 1) * puVar5[8];
            puVar5[9] = (uint)bVar15 * auVar42._36_4_ | (uint)!bVar15 * puVar5[9];
            puVar5[10] = (uint)bVar16 * auVar42._40_4_ | (uint)!bVar16 * puVar5[10];
            puVar5[0xb] = (uint)bVar17 * auVar42._44_4_ | (uint)!bVar17 * puVar5[0xb];
            puVar5[0xc] = (uint)bVar18 * auVar42._48_4_ | (uint)!bVar18 * puVar5[0xc];
            puVar5[0xd] = (uint)bVar19 * auVar42._52_4_ | (uint)!bVar19 * puVar5[0xd];
            puVar5[0xe] = (uint)bVar20 * auVar42._56_4_ | (uint)!bVar20 * puVar5[0xe];
            puVar5[0xf] = (uint)(bVar14 >> 7) * auVar42._60_4_ |
                          (uint)!(bool)(bVar14 >> 7) * puVar5[0xf];
            uVar31 = uVar31 + 0x10;
          } while (((ulong)(~uVar27 + uVar25) + 0x10 & 0x1fffffff0) != uVar31);
        }
        uVar28 = uVar28 + 1;
      } while (uVar28 != uVar35);
    }
  }
  else if (iVar23 == 1) {
    iVar26 = iVar26 * iVar32;
    pp_Var3 = this->_vptr_PReLU_x86_avx512;
    p_Var4 = pp_Var3[-3];
    pauVar37 = (undefined1 (*) [64])bottom_top_blob->data;
    puVar5 = *(uint **)(&this->field_0xd8 + (long)p_Var4);
    if (*(int *)(&this->field_0xd0 + (long)p_Var4) < 2) {
      uVar35 = *puVar5;
      iVar23 = iVar26 + 0xf;
      if (-1 < iVar26) {
        iVar23 = iVar26;
      }
      uVar25 = iVar23 >> 4;
      if (0xf < iVar26) {
        auVar39 = vbroadcastss_avx512f(ZEXT416(uVar35));
        uVar28 = (ulong)uVar25;
        pauVar36 = pauVar37;
        do {
          auVar40 = vmaxps_avx512f(*pauVar36,ZEXT1664(ZEXT816(0) << 0x40));
          auVar45 = vminps_avx512f(*pauVar36,ZEXT1664(ZEXT816(0) << 0x40));
          auVar40 = vfmadd213ps_avx512f(auVar45,auVar39,auVar40);
          *pauVar36 = auVar40;
          pauVar36 = pauVar36 + 1;
          uVar28 = uVar28 - 1;
        } while (uVar28 != 0);
      }
      iVar32 = iVar26 + uVar25 * -0x10;
      iVar23 = iVar32 + 7;
      if (-1 < iVar32) {
        iVar23 = iVar32;
      }
      if (7 < iVar32) {
        auVar47._4_4_ = uVar35;
        auVar47._0_4_ = uVar35;
        auVar47._8_4_ = uVar35;
        auVar47._12_4_ = uVar35;
        auVar47._16_4_ = uVar35;
        auVar47._20_4_ = uVar35;
        auVar47._24_4_ = uVar35;
        auVar47._28_4_ = uVar35;
        uVar28 = (ulong)(uint)(iVar23 >> 3);
        pauVar29 = (undefined1 (*) [32])(*pauVar37 + (long)(int)(uVar25 * 0x10) * 4);
        do {
          auVar50 = vmaxps_avx(*pauVar29,ZEXT1632(ZEXT816(0) << 0x40));
          auVar51 = vminps_avx(*pauVar29,ZEXT1632(ZEXT816(0) << 0x40));
          auVar46 = vfmadd213ps_fma(auVar51,auVar47,auVar50);
          *pauVar29 = ZEXT1632(auVar46);
          pauVar29 = pauVar29 + 1;
          uVar28 = uVar28 - 1;
        } while (uVar28 != 0);
      }
      iVar23 = uVar25 * 0x10 + (iVar23 >> 3) * 8;
      iVar33 = iVar26 - iVar23;
      iVar32 = iVar33 + 3;
      if (-1 < iVar33) {
        iVar32 = iVar33;
      }
      if (3 < iVar33) {
        auVar46._4_4_ = uVar35;
        auVar46._0_4_ = uVar35;
        auVar46._8_4_ = uVar35;
        auVar46._12_4_ = uVar35;
        uVar28 = (ulong)(uint)(iVar32 >> 2);
        pauVar30 = (undefined1 (*) [16])(*pauVar37 + (long)iVar23 * 4);
        do {
          auVar48 = vmaxps_avx(*pauVar30,ZEXT816(0) << 0x40);
          auVar49 = vminps_avx(*pauVar30,ZEXT816(0) << 0x40);
          auVar48 = vfmadd213ps_fma(auVar49,auVar46,auVar48);
          *pauVar30 = auVar48;
          pauVar30 = pauVar30 + 1;
          uVar28 = uVar28 - 1;
        } while (uVar28 != 0);
      }
      iVar23 = iVar23 + (iVar32 >> 2) * 4;
      if (iVar23 < iVar26) {
        lVar34 = (long)iVar23;
        auVar39 = vpbroadcastq_avx512f();
        auVar40 = vbroadcastss_avx512f(ZEXT416(uVar35));
        uVar28 = 0;
        auVar45 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar43 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        do {
          auVar41 = vpbroadcastq_avx512f();
          auVar42 = vporq_avx512f(auVar41,auVar45);
          auVar41 = vporq_avx512f(auVar41,auVar43);
          uVar21 = vpcmpuq_avx512f(auVar41,auVar39,2);
          uVar22 = vpcmpuq_avx512f(auVar42,auVar39,2);
          bVar14 = (byte)uVar22;
          uVar38 = CONCAT11(bVar14,(byte)uVar21);
          piVar1 = (int *)(*pauVar37 + uVar28 * 4 + lVar34 * 4);
          auVar41._4_4_ = (uint)((byte)(uVar38 >> 1) & 1) * piVar1[1];
          auVar41._0_4_ = (uint)((byte)uVar21 & 1) * *piVar1;
          auVar41._8_4_ = (uint)((byte)(uVar38 >> 2) & 1) * piVar1[2];
          auVar41._12_4_ = (uint)((byte)(uVar38 >> 3) & 1) * piVar1[3];
          auVar41._16_4_ = (uint)((byte)(uVar38 >> 4) & 1) * piVar1[4];
          auVar41._20_4_ = (uint)((byte)(uVar38 >> 5) & 1) * piVar1[5];
          auVar41._24_4_ = (uint)((byte)(uVar38 >> 6) & 1) * piVar1[6];
          auVar41._28_4_ = (uint)((byte)(uVar38 >> 7) & 1) * piVar1[7];
          auVar41._32_4_ = (uint)(bVar14 & 1) * piVar1[8];
          auVar41._36_4_ = (uint)(bVar14 >> 1 & 1) * piVar1[9];
          auVar41._40_4_ = (uint)(bVar14 >> 2 & 1) * piVar1[10];
          auVar41._44_4_ = (uint)(bVar14 >> 3 & 1) * piVar1[0xb];
          auVar41._48_4_ = (uint)(bVar14 >> 4 & 1) * piVar1[0xc];
          auVar41._52_4_ = (uint)(bVar14 >> 5 & 1) * piVar1[0xd];
          auVar41._56_4_ = (uint)(bVar14 >> 6 & 1) * piVar1[0xe];
          auVar41._60_4_ = (uint)(bVar14 >> 7) * piVar1[0xf];
          uVar21 = vcmpps_avx512f(auVar41,ZEXT1664(ZEXT816(0) << 0x40),1);
          uVar38 = uVar38 & (ushort)uVar21;
          auVar41 = vmulps_avx512f(auVar41,auVar40);
          puVar5 = (uint *)(*pauVar37 + uVar28 * 4 + lVar34 * 4);
          bVar6 = (bool)((byte)uVar38 & 1);
          bVar7 = (bool)((byte)(uVar38 >> 1) & 1);
          bVar8 = (bool)((byte)(uVar38 >> 2) & 1);
          bVar9 = (bool)((byte)(uVar38 >> 3) & 1);
          bVar10 = (bool)((byte)(uVar38 >> 4) & 1);
          bVar11 = (bool)((byte)(uVar38 >> 5) & 1);
          bVar12 = (bool)((byte)(uVar38 >> 6) & 1);
          bVar13 = (bool)((byte)(uVar38 >> 7) & 1);
          bVar14 = (byte)(uVar38 >> 8);
          bVar15 = (bool)(bVar14 >> 1 & 1);
          bVar16 = (bool)(bVar14 >> 2 & 1);
          bVar17 = (bool)(bVar14 >> 3 & 1);
          bVar18 = (bool)(bVar14 >> 4 & 1);
          bVar19 = (bool)(bVar14 >> 5 & 1);
          bVar20 = (bool)(bVar14 >> 6 & 1);
          *puVar5 = (uint)bVar6 * auVar41._0_4_ | (uint)!bVar6 * *puVar5;
          puVar5[1] = (uint)bVar7 * auVar41._4_4_ | (uint)!bVar7 * puVar5[1];
          puVar5[2] = (uint)bVar8 * auVar41._8_4_ | (uint)!bVar8 * puVar5[2];
          puVar5[3] = (uint)bVar9 * auVar41._12_4_ | (uint)!bVar9 * puVar5[3];
          puVar5[4] = (uint)bVar10 * auVar41._16_4_ | (uint)!bVar10 * puVar5[4];
          puVar5[5] = (uint)bVar11 * auVar41._20_4_ | (uint)!bVar11 * puVar5[5];
          puVar5[6] = (uint)bVar12 * auVar41._24_4_ | (uint)!bVar12 * puVar5[6];
          puVar5[7] = (uint)bVar13 * auVar41._28_4_ | (uint)!bVar13 * puVar5[7];
          puVar5[8] = (uint)(bVar14 & 1) * auVar41._32_4_ | (uint)!(bool)(bVar14 & 1) * puVar5[8];
          puVar5[9] = (uint)bVar15 * auVar41._36_4_ | (uint)!bVar15 * puVar5[9];
          puVar5[10] = (uint)bVar16 * auVar41._40_4_ | (uint)!bVar16 * puVar5[10];
          puVar5[0xb] = (uint)bVar17 * auVar41._44_4_ | (uint)!bVar17 * puVar5[0xb];
          puVar5[0xc] = (uint)bVar18 * auVar41._48_4_ | (uint)!bVar18 * puVar5[0xc];
          puVar5[0xd] = (uint)bVar19 * auVar41._52_4_ | (uint)!bVar19 * puVar5[0xd];
          puVar5[0xe] = (uint)bVar20 * auVar41._56_4_ | (uint)!bVar20 * puVar5[0xe];
          puVar5[0xf] = (uint)(bVar14 >> 7) * auVar41._60_4_ |
                        (uint)!(bool)(bVar14 >> 7) * puVar5[0xf];
          uVar28 = uVar28 + 0x10;
        } while (((iVar26 - lVar34) + 0xfU & 0xfffffffffffffff0) != uVar28);
      }
    }
    else {
      iVar23 = iVar26 + 0xf;
      if (-1 < iVar26) {
        iVar23 = iVar26;
      }
      uVar35 = iVar23 >> 4;
      if (0xf < iVar26) {
        uVar28 = (ulong)uVar35;
        lVar34 = 0;
        do {
          auVar39 = vmaxps_avx512f(*(undefined1 (*) [64])(*pauVar37 + lVar34),
                                   ZEXT1664(ZEXT816(0) << 0x40));
          auVar40 = vminps_avx512f(*(undefined1 (*) [64])(*pauVar37 + lVar34),
                                   ZEXT1664(ZEXT816(0) << 0x40));
          auVar39 = vfmadd132ps_avx512f(auVar40,auVar39,
                                        *(undefined1 (*) [64])((long)puVar5 + lVar34));
          *(undefined1 (*) [64])(*pauVar37 + lVar34) = auVar39;
          lVar34 = lVar34 + 0x40;
          uVar28 = uVar28 - 1;
        } while (uVar28 != 0);
      }
      iVar32 = iVar26 + uVar35 * -0x10;
      iVar23 = iVar32 + 7;
      if (-1 < iVar32) {
        iVar23 = iVar32;
      }
      if (7 < iVar32) {
        uVar28 = (ulong)(uint)(iVar23 >> 3);
        lVar34 = (long)(int)(uVar35 * 0x10) << 2;
        do {
          auVar47 = vmaxps_avx(*(undefined1 (*) [32])(*pauVar37 + lVar34),
                               ZEXT1632(ZEXT816(0) << 0x40));
          auVar50 = vminps_avx(*(undefined1 (*) [32])(*pauVar37 + lVar34),
                               ZEXT1632(ZEXT816(0) << 0x40));
          auVar46 = vfmadd132ps_fma(auVar50,auVar47,*(undefined1 (*) [32])((long)puVar5 + lVar34));
          *(undefined1 (*) [32])(*pauVar37 + lVar34) = ZEXT1632(auVar46);
          lVar34 = lVar34 + 0x20;
          uVar28 = uVar28 - 1;
        } while (uVar28 != 0);
      }
      iVar23 = uVar35 * 0x10 + (iVar23 >> 3) * 8;
      iVar33 = iVar26 - iVar23;
      iVar32 = iVar33 + 3;
      if (-1 < iVar33) {
        iVar32 = iVar33;
      }
      uVar28 = (ulong)(uint)(iVar32 >> 2);
      if (3 < iVar33) {
        lVar34 = (long)iVar23 << 2;
        do {
          auVar46 = vmaxps_avx(*(undefined1 (*) [16])(*pauVar37 + lVar34),ZEXT816(0) << 0x40);
          auVar48 = vminps_avx(*(undefined1 (*) [16])(*pauVar37 + lVar34),ZEXT816(0) << 0x40);
          auVar46 = vfmadd132ps_fma(auVar48,auVar46,*(undefined1 (*) [16])((long)puVar5 + lVar34));
          *(undefined1 (*) [16])(*pauVar37 + lVar34) = auVar46;
          lVar34 = lVar34 + 0x10;
          uVar28 = uVar28 - 1;
        } while (uVar28 != 0);
      }
      iVar23 = iVar23 + (iVar32 >> 2) * 4;
      if (iVar23 < iVar26) {
        lVar34 = (long)iVar23;
        do {
          if (*(float *)(*pauVar37 + lVar34 * 4) < 0.0) {
            *(float *)(*pauVar37 + lVar34 * 4) =
                 *(float *)(*pauVar37 + lVar34 * 4) *
                 *(float *)(*(long *)(&this->field_0xd8 + (long)pp_Var3[-3]) + lVar34 * 4);
          }
          lVar34 = lVar34 + 1;
        } while (lVar34 < iVar26);
      }
    }
  }
  return 0;
}

Assistant:

int PReLU_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;

    if (dims == 1)
    {
        const int size = w * elempack;

        if (num_slope > 1)
        {
            float* ptr = bottom_top_blob;
            const float* slope = slope_data;

            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _slope512 = _mm512_loadu_ps(slope + i);
                _mm512_storeu_ps(ptr + i, prelu_avx512(_p512, _slope512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _slope256 = _mm256_loadu_ps(slope + i);
                _mm256_storeu_ps(ptr + i, prelu_avx(_p256, _slope256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _slope128 = _mm_load_ps(slope + i);
                _mm_store_ps(ptr + i, prelu_sse(_p128, _slope128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope_data[i];
            }
        }
        else
        {
            float* ptr = bottom_top_blob;
            const float slope = slope_data[0];

            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _slope512 = _mm512_set1_ps(slope);
                _mm512_storeu_ps(ptr + i, prelu_avx512(_p512, _slope512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _slope256 = _mm256_set1_ps(slope);
                _mm256_storeu_ps(ptr + i, prelu_avx(_p256, _slope256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _slope128 = _mm_set1_ps(slope);
                _mm_store_ps(ptr + i, prelu_sse(_p128, _slope128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope;
            }
        }
    }

    if (dims == 2)
    {
        const int size = w * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            int j = 0;

            float slope = num_slope > 1 ? slope_data[i] : slope_data[0];
#if __SSE2__
            __m128 _slope128 = num_slope > 1 && (elempack == 4) ? _mm_load_ps((const float*)slope_data + i * 4) : _mm_set1_ps(slope);
#if __AVX__
            __m256 _slope256 = num_slope > 1 && (elempack == 8) ? _mm256_loadu_ps((const float*)slope_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_slope128), _slope128, 1);
#if __AVX512F__
            __m512 _slope512 = num_slope > 1 && (elempack == 16) ? _mm512_loadu_ps((const float*)slope_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_slope256), _slope256, 1);

            for (; j + 15 < size; j += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, prelu_avx512(_p512, _slope512));
                ptr += 16;
            }
#endif // __AVX512F__
            for (; j + 7 < size; j += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, prelu_avx(_p256, _slope256));
                ptr += 8;
            }
#endif // __AVX__
            for (; j + 3 < size; j += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _mm_storeu_ps(ptr, prelu_sse(_p128, _slope128));
                ptr += 4;
            }
#endif // __SSE2__
            for (; j < size; j++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    if (dims == 3)
    {
        const int size = w * h * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            int i = 0;

            float slope = num_slope > 1 ? slope_data[q] : slope_data[0];
#if __SSE2__
            __m128 _slope128 = num_slope > 1 && (elempack == 4) ? _mm_load_ps((const float*)slope_data + q * 4) : _mm_set1_ps(slope);
#if __AVX__
            __m256 _slope256 = num_slope > 1 && (elempack == 8) ? _mm256_loadu_ps((const float*)slope_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_slope128), _slope128, 1);
#if __AVX512F__
            __m512 _slope512 = num_slope > 1 && (elempack == 16) ? _mm512_loadu_ps((const float*)slope_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_slope256), _slope256, 1);

            for (; i + 15 < size; i += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, prelu_avx512(_p512, _slope512));
                ptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, prelu_avx(_p256, _slope256));
                ptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p128 = _mm_load_ps(ptr);
                _mm_store_ps(ptr, prelu_sse(_p128, _slope128));
                ptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    return 0;
}